

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O1

void __thiscall dg::LLVMDependenceGraph::~LLVMDependenceGraph(LLVMDependenceGraph *this)

{
  LLVMNode *pLVar1;
  LLVMDependenceGraph *pLVar2;
  DGParameters<dg::LLVMNode> *pDVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  BBlock<dg::LLVMNode> *this_00;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  int iVar8;
  LLVMDependenceGraph *__range1;
  
  (this->super_DependenceGraph<dg::LLVMNode>).super_DependenceGraphBase._vptr_DependenceGraphBase =
       (_func_int **)&PTR__LLVMDependenceGraph_0011ea08;
  for (p_Var7 = (this->super_DependenceGraph<dg::LLVMNode>).nodes._M_t._M_impl.super__Rb_tree_header
                ._M_header._M_left;
      (_Rb_tree_header *)p_Var7 !=
      &(this->super_DependenceGraph<dg::LLVMNode>).nodes._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    pLVar1 = (LLVMNode *)p_Var7[1]._M_parent;
    if (pLVar1 != (LLVMNode *)0x0) {
      for (p_Var6 = (pLVar1->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                    subgraphs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 !=
          &(pLVar1->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).subgraphs._M_t
           ._M_impl.super__Rb_tree_header; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        pLVar2 = *(LLVMDependenceGraph **)(p_Var6 + 1);
        iVar8 = (pLVar2->super_DependenceGraph<dg::LLVMNode>).super_DependenceGraphBase.refcount +
                -1;
        (pLVar2->super_DependenceGraph<dg::LLVMNode>).super_DependenceGraphBase.refcount = iVar8;
        if (iVar8 == 0 && pLVar2 != this) {
          (*(pLVar2->super_DependenceGraph<dg::LLVMNode>).super_DependenceGraphBase.
            _vptr_DependenceGraphBase[1])();
        }
      }
      pDVar3 = (pLVar1->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).parameters
      ;
      if (pDVar3 != (DGParameters<dg::LLVMNode> *)0x0) {
        DGParameters<dg::LLVMNode>::~DGParameters(pDVar3);
        operator_delete(pDVar3,0x88);
      }
      LLVMNode::~LLVMNode(pLVar1);
      operator_delete(pLVar1,0x1f0);
    }
  }
  peVar4 = (this->super_DependenceGraph<dg::LLVMNode>).global_nodes.
           super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (((peVar4 != (element_type *)0x0) &&
      (p_Var5 = (this->super_DependenceGraph<dg::LLVMNode>).global_nodes.
                super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi, p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
     && (p_Var5->_M_use_count == 1)) {
    for (p_Var7 = (peVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(peVar4->_M_t)._M_impl.super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      pLVar1 = (LLVMNode *)p_Var7[1]._M_parent;
      if (pLVar1 != (LLVMNode *)0x0) {
        LLVMNode::~LLVMNode(pLVar1);
        operator_delete(pLVar1,0x1f0);
      }
    }
  }
  pDVar3 = (this->super_DependenceGraph<dg::LLVMNode>).formalParameters;
  if (pDVar3 != (DGParameters<dg::LLVMNode> *)0x0) {
    DGParameters<dg::LLVMNode>::~DGParameters(pDVar3);
    operator_delete(pDVar3,0x88);
  }
  this_00 = (this->super_DependenceGraph<dg::LLVMNode>).PDTreeRoot;
  if (this_00 != (BBlock<dg::LLVMNode> *)0x0) {
    BBlock<dg::LLVMNode>::~BBlock(this_00);
    operator_delete(this_00,0x208);
  }
  std::
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  ::_M_erase(&(this->callNodes)._M_t,
             (_Link_type)(this->callNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::unique_ptr<dg::BBlock<dg::LLVMNode>,_std::default_delete<dg::BBlock<dg::LLVMNode>_>_>::
  ~unique_ptr(&this->unifiedExitBB);
  DependenceGraph<dg::LLVMNode>::~DependenceGraph(&this->super_DependenceGraph<dg::LLVMNode>);
  return;
}

Assistant:

LLVMDependenceGraph::~LLVMDependenceGraph() {
    // delete nodes
    for (auto &I : *this) {
        LLVMNode *node = I.second;

        if (node) {
            for (LLVMDependenceGraph *subgraph : node->getSubgraphs()) {
                // graphs are referenced, once the refcount is 0
                // the graph will be deleted
                // Because of recursive calls, graph can be its
                // own subgraph. In that case we're in the destructor
                // already, so do not delete it
                subgraph->unref(subgraph != this);
            }

            // delete parameters (on null it is no op)
            delete node->getParameters();

#ifdef DEBUG_ENABLED
            if (!node->getBBlock() && !llvm::isa<llvm::Function>(*I.first))
                llvmutils::printerr("Had no BB assigned", I.first);
#endif

            delete node;
        } else {
#ifdef DEBUG_ENABLED
            llvmutils::printerr("Had no node assigned", I.first);
#endif //
        }
    }

    // delete global nodes if this is the last graph holding them
    if (global_nodes && global_nodes.use_count() == 1) {
        for (auto &it : *global_nodes)
            delete it.second;
    }

    // delete formal parameters
    delete getParameters();

    // delete post-dominator tree root
    delete getPostDominatorTreeRoot();
}